

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_preserve_unknown_enum_unittest::MyMessage::_InternalSerialize
          (MyMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  MyEnum MVar2;
  int iVar3;
  uint uVar4;
  OCase OVar5;
  uint32_t *puVar6;
  uint8_t *puVar7;
  RepeatedField<int> *pRVar8;
  const_reference piVar9;
  LogMessage *pLVar10;
  const_pointer piVar11;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar12;
  int local_12c;
  int n_1;
  int i_1;
  size_t byte_size;
  int local_118;
  int n;
  int i;
  uint32_t cached_has_bits;
  MyMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MyMessage *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  byte *local_88;
  ulong local_80;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar6 & 1) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    MVar2 = _internal_e(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,MVar2,puVar7);
  }
  local_118 = 0;
  iVar3 = _internal_repeated_e_size(this);
  for (; local_118 < iVar3; local_118 = local_118 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar8 = _internal_repeated_e(this);
    piVar9 = google::protobuf::RepeatedField<int>::Get(pRVar8,local_118);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(2,*piVar9,puVar7);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_packed_e_cached_byte_size_);
  if (uVar4 != 0) {
    pRVar8 = _internal_repeated_packed_e(this);
    local_40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_34 = 3;
    local_38 = 2;
    local_30 = stream;
    if (stream->end_ <= local_40) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_1c = 0x1a;
    local_28 = local_40;
    while (0x7f < local_1c) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
      local_1c = 0;
    }
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)(local_28 + 1);
    for (local_c = uVar4; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = local_b0;
    piVar11 = google::protobuf::RepeatedField<int>::data(pRVar8);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar8);
    end = piVar11;
    do {
      local_88 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      piVar12 = end + 1;
      for (local_80 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_80; local_80 = local_80 >> 7) {
        *local_88 = (byte)local_80 | 0x80;
        local_88 = local_88 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_88 + 1);
      *local_88 = (byte)local_80;
      end = piVar12;
      local_b0 = stream_local;
    } while (piVar12 < piVar11 + iVar3);
  }
  local_12c = 0;
  iVar3 = _internal_repeated_packed_unexpected_e_size(this);
  for (; local_12c < iVar3; local_12c = local_12c + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pRVar8 = _internal_repeated_packed_unexpected_e(this);
    piVar9 = google::protobuf::RepeatedField<int>::Get(pRVar8,local_12c);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(4,*piVar9,puVar7);
  }
  OVar5 = o_case(this);
  if (OVar5 == kOneofE1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    MVar2 = _internal_oneof_e_1(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(5,MVar2,puVar7);
  }
  else if (OVar5 == kOneofE2) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    MVar2 = _internal_oneof_e_2(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(6,MVar2,puVar7);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MyMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_e(), target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
  for (int i = 0, n = this_._internal_repeated_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_e().Get(i)),
        target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._repeated_packed_e_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_repeated_packed_e(), byte_size, target);
    }
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
  for (int i = 0, n = this_._internal_repeated_packed_unexpected_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_packed_unexpected_e().Get(i)),
        target);
  }

  switch (this_.o_case()) {
    case kOneofE1: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          5, this_._internal_oneof_e_1(), target);
      break;
    }
    case kOneofE2: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          6, this_._internal_oneof_e_2(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_preserve_unknown_enum_unittest.MyMessage)
  return target;
}